

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  size_t in_R9;
  string_view format;
  undefined8 local_28;
  undefined8 local_20;
  
  local_20 = **(undefined8 **)this;
  local_28 = (*(undefined8 **)this)[1];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_28;
  format._M_len = (size_t)"Enum value \"$0\" is reserved multiple times.";
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x2b,format,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}